

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O2

void vkt::wsi::anon_unknown_0::deinitSemaphores
               (DeviceInterface *vkd,VkDevice device,
               vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
               *semaphores)

{
  pointer pHVar1;
  pointer pHVar2;
  ulong uVar3;
  
  pHVar2 = (semaphores->
           super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (uVar3 = 0;
      pHVar1 = (semaphores->
               super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
      uVar3 < (ulong)((long)pHVar1 - (long)pHVar2 >> 3); uVar3 = uVar3 + 1) {
    if (pHVar2[uVar3].m_internal != 0) {
      (*vkd->_vptr_DeviceInterface[0x18])(vkd,device,pHVar2[uVar3].m_internal,0);
      pHVar2 = (semaphores->
               super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    pHVar2[uVar3].m_internal = 0;
  }
  if (pHVar1 != pHVar2) {
    (semaphores->
    super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pHVar2;
  }
  return;
}

Assistant:

void deinitSemaphores (const vk::DeviceInterface&	vkd,
					 vk::VkDevice					device,
					 std::vector<vk::VkSemaphore>&	semaphores)
{
	for (size_t ndx = 0; ndx < semaphores.size(); ndx++)
	{
		if (semaphores[ndx] != (vk::VkSemaphore)0)
			vkd.destroySemaphore(device, semaphores[ndx], DE_NULL);

		semaphores[ndx] = (vk::VkSemaphore)0;
	}

	semaphores.clear();
}